

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

Output * grib2dec_demo::Output::create(string *filename,string *format)

{
  bool bVar1;
  Svg *this;
  
  if (format->_M_string_length == 0 && filename->_M_string_length == 0) {
    this = (Svg *)operator_new(0x210);
    Output((Output *)this);
    (this->super_Output)._vptr_Output = (_func_int **)&PTR_setComponent_00106cc8;
  }
  else {
    bVar1 = std::operator==(format,"svg");
    if (bVar1) {
      this = (Svg *)operator_new(0x280);
      Svg::Svg(this,filename);
    }
    else {
      this = (Svg *)operator_new(0x210);
      Txt::Txt((Txt *)this,filename);
    }
  }
  return &this->super_Output;
}

Assistant:

Output *Output::create(const std::string& filename, const std::string& format)
{
    if (filename.empty() && format.empty())
        return new NullOutput();
    else if (format == "svg")
        return new Svg(filename);
    else
        // txt by default
        return new Txt(filename);
}